

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::_move(Tree *this,Tree *that)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  code *pcVar3;
  size_t sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  bool bVar11;
  long lVar12;
  char msg [33];
  char local_b8 [40];
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  char *pcStack_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  char *pcStack_28;
  undefined8 local_20;
  
  if (this->m_buf != (NodeData *)0x0) {
    builtin_strncpy(local_b8 + 0x10,"_buf == nullptr)",0x11);
    builtin_strncpy(local_b8,"check failed: (m",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_40 = 0;
    uStack_38 = 0x62fa;
    local_30 = 0;
    pcStack_28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_20 = 0x65;
    LVar8.super_LineCol.col = 0;
    LVar8.super_LineCol.offset = SUB168(ZEXT816(0x62fa) << 0x40,0);
    LVar8.super_LineCol.line = SUB168(ZEXT816(0x62fa) << 0x40,8);
    LVar8.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar8.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_b8,0x21,LVar8,(this->m_callbacks).m_user_data);
  }
  if ((this->m_arena).str != (char *)0x0) {
    builtin_strncpy(local_b8,"check failed: (m_arena.str == nullptr)",0x27);
    if (((byte)s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_68 = 0;
    uStack_60 = 0x62fb;
    local_58 = 0;
    pcStack_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_48 = 0x65;
    LVar9.super_LineCol.col = 0;
    LVar9.super_LineCol.offset = SUB168(ZEXT816(0x62fb) << 0x40,0);
    LVar9.super_LineCol.line = SUB168(ZEXT816(0x62fb) << 0x40,8);
    LVar9.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar9.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_b8,0x27,LVar9,(this->m_callbacks).m_user_data);
  }
  if ((this->m_arena).len != 0) {
    builtin_strncpy(local_b8 + 0x10,"_arena.len == 0)",0x11);
    builtin_strncpy(local_b8,"check failed: (m",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_90 = 0;
    uStack_88 = 0x62fc;
    local_80 = 0;
    pcStack_78 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_70 = 0x65;
    LVar10.super_LineCol.col = 0;
    LVar10.super_LineCol.offset = SUB168(ZEXT816(0x62fc) << 0x40,0);
    LVar10.super_LineCol.line = SUB168(ZEXT816(0x62fc) << 0x40,8);
    LVar10.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar10.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_b8,0x21,LVar10,(this->m_callbacks).m_user_data);
  }
  this->m_buf = that->m_buf;
  sVar4 = that->m_size;
  this->m_cap = that->m_cap;
  this->m_size = sVar4;
  sVar4 = that->m_free_tail;
  this->m_free_head = that->m_free_head;
  this->m_free_tail = sVar4;
  sVar4 = (that->m_arena).len;
  (this->m_arena).str = (that->m_arena).str;
  (this->m_arena).len = sVar4;
  this->m_arena_pos = that->m_arena_pos;
  lVar12 = 0x60;
  do {
    *(undefined8 *)((long)this->m_tag_directives + lVar12 + -0x40) =
         *(undefined8 *)((long)that->m_tag_directives + lVar12 + -0x40);
    puVar1 = (undefined8 *)((long)that->m_tag_directives + lVar12 + -0x60);
    uVar5 = *puVar1;
    uVar6 = puVar1[1];
    puVar1 = (undefined8 *)((long)(that->m_tag_directives + -2) + lVar12);
    uVar7 = puVar1[1];
    puVar2 = (undefined8 *)((long)(this->m_tag_directives + -2) + lVar12);
    *puVar2 = *puVar1;
    puVar2[1] = uVar7;
    puVar1 = (undefined8 *)((long)this->m_tag_directives + lVar12 + -0x60);
    *puVar1 = uVar5;
    puVar1[1] = uVar6;
    lVar12 = lVar12 + 0x28;
  } while (lVar12 != 0x100);
  (that->m_arena).len = 0;
  that->m_arena_pos = 0;
  that->m_free_tail = 0;
  (that->m_arena).str = (char *)0x0;
  that->m_size = 0;
  that->m_free_head = 0;
  that->m_buf = (NodeData *)0x0;
  that->m_cap = 0;
  memset(that->m_tag_directives,0,0xa0);
  return;
}

Assistant:

void Tree::_move(Tree & that)
{
    _RYML_CB_ASSERT(m_callbacks, m_buf == nullptr);
    _RYML_CB_ASSERT(m_callbacks, m_arena.str == nullptr);
    _RYML_CB_ASSERT(m_callbacks, m_arena.len == 0);
    m_buf = that.m_buf;
    m_cap = that.m_cap;
    m_size = that.m_size;
    m_free_head = that.m_free_head;
    m_free_tail = that.m_free_tail;
    m_arena = that.m_arena;
    m_arena_pos = that.m_arena_pos;
    for(size_t i = 0; i < RYML_MAX_TAG_DIRECTIVES; ++i)
        m_tag_directives[i] = that.m_tag_directives[i];
    that._clear();
}